

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

void __thiscall
slang::ast::CaseAssertionExpr::serializeTo(CaseAssertionExpr *this,ASTSerializer *serializer)

{
  size_type sVar1;
  pointer ppEVar2;
  AssertionExpr *__n;
  pointer pIVar3;
  long lVar4;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  pointer pIVar5;
  string_view name;
  string_view name_00;
  
  ASTSerializer::write(serializer,4,"expr",(size_t)this->expr);
  name._M_str = "items";
  name._M_len = 5;
  ASTSerializer::startArray(serializer,name);
  sVar1 = (this->items).size_;
  if (sVar1 != 0) {
    pIVar5 = (this->items).data_;
    pIVar3 = pIVar5 + sVar1;
    do {
      ASTSerializer::startObject(serializer);
      name_00._M_str = "expressions";
      name_00._M_len = 0xb;
      ASTSerializer::startArray(serializer,name_00);
      sVar1 = (pIVar5->expressions).size_;
      if (sVar1 != 0) {
        ppEVar2 = (pIVar5->expressions).data_;
        lVar4 = 0;
        do {
          ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar2 + lVar4));
          lVar4 = lVar4 + 8;
        } while (sVar1 << 3 != lVar4);
      }
      ASTSerializer::endArray(serializer);
      __n = (pIVar5->body).ptr;
      if (__n == (AssertionExpr *)0x0) {
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<const slang::ast::AssertionExpr *>::get() const [T = const slang::ast::AssertionExpr *]"
                  );
      }
      ASTSerializer::write(serializer,4,"body",(size_t)__n);
      ASTSerializer::endObject(serializer);
      pIVar5 = pIVar5 + 1;
    } while (pIVar5 != pIVar3);
  }
  ASTSerializer::endArray(serializer);
  if (this->defaultCase != (AssertionExpr *)0x0) {
    ASTSerializer::write(serializer,0xb,"defaultCase",(size_t)this->defaultCase);
    return;
  }
  return;
}

Assistant:

void CaseAssertionExpr::serializeTo(ASTSerializer& serializer) const {
    serializer.write("expr", expr);

    serializer.startArray("items");
    for (auto const& item : items) {
        serializer.startObject();

        serializer.startArray("expressions");
        for (auto ex : item.expressions)
            serializer.serialize(*ex);
        serializer.endArray();

        serializer.write("body", *item.body);

        serializer.endObject();
    }
    serializer.endArray();

    if (defaultCase)
        serializer.write("defaultCase", *defaultCase);
}